

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

ConfidentialTxOutReference * __thiscall
cfd::ConfidentialTransactionController::AddTxOut
          (ConfidentialTransactionController *this,Address *address,Amount *value,
          ConfidentialAssetId *asset)

{
  Address *in_RDX;
  ConfidentialNonce *in_RSI;
  ConfidentialTxOutReference *in_RDI;
  Script *in_R8;
  Script locking_script;
  ByteData hash_data;
  Address *in_stack_ffffffffffffff28;
  ConfidentialAssetId *in_stack_ffffffffffffff50;
  Amount *in_stack_ffffffffffffff58;
  Script *in_stack_ffffffffffffff60;
  ConfidentialTransactionController *in_stack_ffffffffffffff68;
  Script local_78;
  Script *local_28;
  Address *local_18;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  core::Address::GetHash(in_stack_ffffffffffffff28);
  core::Address::GetLockingScript(&local_78,local_18);
  core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&stack0xffffffffffffff50);
  AddTxOut(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
           in_stack_ffffffffffffff50,in_RSI);
  core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x556f95);
  core::Script::~Script(local_28);
  core::ByteData::~ByteData((ByteData *)0x556fac);
  return in_RDI;
}

Assistant:

const ConfidentialTxOutReference ConfidentialTransactionController::AddTxOut(
    const Address& address, const Amount& value,
    const ConfidentialAssetId& asset) {
  const ByteData hash_data = address.GetHash();
  Script locking_script = address.GetLockingScript();

  return AddTxOut(locking_script, value, asset, ConfidentialNonce());
}